

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

optional<Patch::Change> * __thiscall
Patch::grab_change_ending_after_new_position
          (optional<Patch::Change> *__return_storage_ptr__,Patch *this,Point target,bool exclusive)

{
  Node *pNVar1;
  undefined7 in_register_00000009;
  optional<Point> exclusive_lower_bound;
  optional<Point> local_30;
  
  optional<Point>::optional(&local_30);
  if ((int)CONCAT71(in_register_00000009,exclusive) != 0) {
    local_30.is_some = true;
    local_30.value = target;
  }
  exclusive_lower_bound.is_some = local_30.is_some;
  exclusive_lower_bound.value = local_30.value;
  exclusive_lower_bound._9_3_ = 0;
  pNVar1 = splay_node_ending_after<Patch::NewCoordinates>(this,target,exclusive_lower_bound);
  if (pNVar1 == (Node *)0x0) {
    optional<Patch::Change>::optional(__return_storage_ptr__);
  }
  else {
    change_for_root_node(&__return_storage_ptr__->value,this);
    __return_storage_ptr__->is_some = true;
  }
  return __return_storage_ptr__;
}

Assistant:

optional<Change> Patch::grab_change_ending_after_new_position(Point target, bool exclusive) {
  optional<Point> exclusive_lower_bound;
  if (exclusive) exclusive_lower_bound = target;
  if (splay_node_ending_after<NewCoordinates>(target, exclusive_lower_bound)) {
    return change_for_root_node();
  } else {
    return optional<Change>{};
  }
}